

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall re2::DFA::StateEqual::operator()(StateEqual *this,State *a,State *b)

{
  uint uVar1;
  ulong uVar2;
  
  if (a == b) {
    return true;
  }
  if (b != (State *)0x0 && a != (State *)0x0) {
    uVar1 = a->ninst_;
    if ((uVar1 == b->ninst_) && (a->flag_ == b->flag_)) {
      if ((int)uVar1 < 1) {
        return true;
      }
      uVar2 = 0;
      do {
        if (a->inst_[uVar2] != b->inst_[uVar2]) {
          return false;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      return uVar1 <= uVar2;
    }
  }
  return false;
}

Assistant:

bool operator()(const State* a, const State* b) const {
      if (a == b)
        return true;
      if (a == NULL || b == NULL)
        return false;
      if (a->ninst_ != b->ninst_)
        return false;
      if (a->flag_ != b->flag_)
        return false;
      for (int i = 0; i < a->ninst_; i++)
        if (a->inst_[i] != b->inst_[i])
          return false;
      return true;  // they're equal
    }